

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConsequenceFinder.cpp
# Opt level: O0

void __thiscall
Saturation::ConsequenceFinder::indexClause
          (ConsequenceFinder *this,uint indexNum,Clause *cl,bool add)

{
  SkipList<Kernel::Clause_*,_Lib::Int> **ppSVar1;
  byte in_CL;
  Clause *in_RDX;
  undefined4 in_ESI;
  Clause *in_stack_ffffffffffffffb8;
  Array<Lib::SkipList<Kernel::Clause_*,_Lib::Int>_*> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_fffffffffffffff0;
  
  if ((in_CL & 1) == 0) {
    Lib::Array<Lib::SkipList<Kernel::Clause_*,_Lib::Int>_*>::operator[]
              (in_stack_ffffffffffffffc0,(size_t)in_stack_ffffffffffffffb8);
    Lib::SkipList<Kernel::Clause*,Lib::Int>::remove<Kernel::Clause*>
              ((SkipList<Kernel::Clause_*,_Lib::Int> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
               in_RDX);
  }
  else {
    ppSVar1 = Lib::Array<Lib::SkipList<Kernel::Clause_*,_Lib::Int>_*>::operator[]
                        (in_stack_ffffffffffffffc0,(size_t)in_stack_ffffffffffffffb8);
    if (*ppSVar1 == (SkipList<Kernel::Clause_*,_Lib::Int> *)0x0) {
      in_stack_ffffffffffffffc0 =
           (Array<Lib::SkipList<Kernel::Clause_*,_Lib::Int>_*> *)
           Lib::SkipList<Kernel::Clause*,Lib::Int>::operator_new(0xac2e83);
      Lib::SkipList<Kernel::Clause_*,_Lib::Int>::SkipList
                ((SkipList<Kernel::Clause_*,_Lib::Int> *)in_stack_ffffffffffffffc0);
      ppSVar1 = Lib::Array<Lib::SkipList<Kernel::Clause_*,_Lib::Int>_*>::operator[]
                          (in_stack_ffffffffffffffc0,(size_t)in_stack_ffffffffffffffb8);
      *ppSVar1 = (SkipList<Kernel::Clause_*,_Lib::Int> *)in_stack_ffffffffffffffc0;
    }
    Lib::Array<Lib::SkipList<Kernel::Clause_*,_Lib::Int>_*>::operator[]
              (in_stack_ffffffffffffffc0,(size_t)in_stack_ffffffffffffffb8);
    Lib::SkipList<Kernel::Clause_*,_Lib::Int>::insert
              ((SkipList<Kernel::Clause_*,_Lib::Int> *)in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

void ConsequenceFinder::indexClause(unsigned indexNum, Clause* cl, bool add)
{
  if(add) {
    if(!_index[indexNum]) {
      _index[indexNum]=new ClauseSL();
    }
    _index[indexNum]->insert(cl);
  }
  else {
    ASS(_index[indexNum]);
    _index[indexNum]->remove(cl);
  }
}